

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

char * tinyformat::detail::streamStateFromFormat
                 (ostream *out,bool *positionalMode,bool *spacePadPositive,int *ntrunc,
                 char *fmtStart,FormatArg *args,int *argIndex,int numArgs)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  format_error *pfVar5;
  uint uVar6;
  long lVar7;
  long in_FS_OFFSET;
  bool bVar8;
  allocator<char> local_61;
  char *c;
  int precision;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*fmtStart != '%') {
    __assert_fail("*fmtStart == \'%\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/tinyformat.h"
                  ,0x29a,
                  "const char *tinyformat::detail::streamStateFromFormat(std::ostream &, bool &, bool &, int &, const char *, const detail::FormatArg *, int &, int)"
                 );
  }
  lVar7 = *(long *)out;
  *(undefined8 *)(out + *(long *)(lVar7 + -0x18) + 0x10) = 0;
  *(undefined8 *)(out + *(long *)(lVar7 + -0x18) + 8) = 6;
  lVar7 = *(long *)(lVar7 + -0x18);
  std::ios::fill();
  out[lVar7 + 0xe0] = (ostream)0x20;
  *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffb000;
  c = fmtStart + 1;
  cVar1 = fmtStart[1];
  if ((byte)(cVar1 - 0x30U) < 10) {
    iVar3 = parseIntAndAdvance(&c);
    if (*c == '$') {
      if ((0 < iVar3) && (iVar3 <= numArgs)) {
        *argIndex = iVar3 + -1;
        c = c + 1;
        *positionalMode = true;
        goto LAB_00116677;
      }
      pfVar5 = (format_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&precision,"tinyformat: Positional argument out of range",&local_61);
      format_error::format_error(pfVar5,(string *)&precision);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pfVar5,&format_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      if (*positionalMode != true) {
        if (cVar1 == '0') {
          lVar7 = *(long *)(*(long *)out + -0x18);
          std::ios::fill();
          out[lVar7 + 0xe0] = (ostream)0x30;
          *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
               *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffff4f | 0x10;
        }
        if (iVar3 != 0) {
          *(long *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = (long)iVar3;
          bVar2 = true;
          lVar7 = 0;
          goto LAB_001167e4;
        }
LAB_00116677:
        lVar7 = 0;
        do {
          cVar1 = *c;
          if (cVar1 == ' ') {
            if (((byte)out[*(long *)(*(long *)out + -0x18) + 0x19] & 8) == 0) {
              *spacePadPositive = true;
            }
          }
          else if (cVar1 == '0') {
            lVar4 = *(long *)(*(long *)out + -0x18);
            if (((byte)out[lVar4 + 0x18] & 0x20) == 0) {
              std::ios::fill();
              out[lVar4 + 0xe0] = (ostream)0x30;
              lVar4 = *(long *)(*(long *)out + -0x18);
              uVar6 = *(uint *)(out + lVar4 + 0x18) & 0xffffff4f | 0x10;
LAB_0011671c:
              *(uint *)(out + lVar4 + 0x18) = uVar6;
            }
          }
          else if (cVar1 == '+') {
            *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
                 *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) | 0x800;
            *spacePadPositive = false;
            lVar7 = 1;
          }
          else {
            if (cVar1 == '-') {
              lVar4 = *(long *)(*(long *)out + -0x18);
              std::ios::fill();
              out[lVar4 + 0xe0] = (ostream)0x20;
              lVar4 = *(long *)(*(long *)out + -0x18);
              uVar6 = *(uint *)(out + lVar4 + 0x18) & 0xffffff4f | 0x20;
              goto LAB_0011671c;
            }
            if (cVar1 != '#') goto LAB_0011675e;
            *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
                 *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) | 0x600;
          }
          c = c + 1;
        } while( true );
      }
      pfVar5 = (format_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&precision,
                 "tinyformat: Non-positional argument used after a positional one",&local_61);
      format_error::format_error(pfVar5,(string *)&precision);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pfVar5,&format_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  else {
    if (*positionalMode != true) goto LAB_00116677;
    pfVar5 = (format_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&precision,
               "tinyformat: Non-positional argument used after a positional one",&local_61);
    format_error::format_error(pfVar5,(string *)&precision);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pfVar5,&format_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  goto LAB_00116cf8;
LAB_0011675e:
  precision = 0;
  bVar2 = parseWidthOrPrecision(&precision,&c,*positionalMode,args,argIndex,numArgs);
  if (bVar2) {
    lVar4 = *(long *)out;
    iVar3 = precision;
    if (precision < 0) {
      lVar4 = *(long *)(lVar4 + -0x18);
      std::ios::fill();
      out[lVar4 + 0xe0] = (ostream)0x20;
      lVar4 = *(long *)out;
      *(uint *)(out + *(long *)(lVar4 + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(lVar4 + -0x18) + 0x18) & 0xffffff4f | 0x20;
      iVar3 = -precision;
    }
    *(long *)(out + *(long *)(lVar4 + -0x18) + 0x10) = (long)iVar3;
  }
LAB_001167e4:
  if (*c == '.') {
    c = c + 1;
    precision = 0;
    parseWidthOrPrecision(&precision,&c,*positionalMode,args,argIndex,numArgs);
    bVar8 = -1 < (long)precision;
    if (bVar8) {
      *(long *)(out + *(long *)(*(long *)out + -0x18) + 8) = (long)precision;
    }
  }
  else {
    bVar8 = false;
  }
LAB_0011684e:
  cVar1 = *c;
  switch(cVar1) {
  case 'E':
    lVar7 = *(long *)out;
    *(uint *)(out + *(long *)(lVar7 + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(lVar7 + -0x18) + 0x18) | 0x4000;
LAB_001169bc:
    *(uint *)(out + *(long *)(lVar7 + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(lVar7 + -0x18) + 0x18) & 0xfffffefb | 0x100;
    lVar7 = *(long *)(lVar7 + -0x18);
    uVar6 = *(uint *)(out + lVar7 + 0x18) & 0xffffffb5 | 2;
LAB_00116a39:
    *(uint *)(out + lVar7 + 0x18) = uVar6;
    goto switchD_00116864_caseD_48;
  case 'F':
    lVar7 = *(long *)out;
    *(uint *)(out + *(long *)(lVar7 + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(lVar7 + -0x18) + 0x18) | 0x4000;
    goto LAB_00116a29;
  case 'G':
    lVar7 = *(long *)out;
    *(uint *)(out + *(long *)(lVar7 + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(lVar7 + -0x18) + 0x18) | 0x4000;
    goto LAB_001169f2;
  case 'H':
  case 'I':
  case 'J':
  case 'K':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'S':
  case 'T':
  case 'U':
  case 'V':
  case 'W':
  case 'Y':
  case 'Z':
  case '[':
  case '\\':
  case ']':
  case '^':
  case '_':
  case '`':
  case 'b':
  case 'c':
  case 'k':
  case 'm':
  case 'q':
  case 'r':
  case 'v':
  case 'w':
  case 'y':
    goto switchD_00116864_caseD_48;
  case 'L':
  case 'h':
  case 'j':
  case 'l':
  case 't':
  case 'z':
    goto switchD_00116864_caseD_4c;
  case 'X':
    lVar4 = *(long *)out;
    *(uint *)(out + *(long *)(lVar4 + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(lVar4 + -0x18) + 0x18) | 0x4000;
    goto LAB_00116982;
  case 'a':
    lVar7 = *(long *)out;
    goto LAB_00116ab8;
  case 'd':
  case 'i':
  case 'u':
    lVar4 = *(long *)out;
    uVar6 = 2;
    break;
  case 'e':
    lVar7 = *(long *)out;
    goto LAB_001169bc;
  case 'f':
    lVar7 = *(long *)out;
LAB_00116a29:
    lVar7 = *(long *)(lVar7 + -0x18);
    uVar6 = *(uint *)(out + lVar7 + 0x18) & 0xfffffefb | 4;
    goto LAB_00116a39;
  case 'g':
    lVar7 = *(long *)out;
LAB_001169f2:
    *(uint *)(out + *(long *)(lVar7 + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(lVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
    *(uint *)(out + *(long *)(lVar7 + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(lVar7 + -0x18) + 0x18) & 0xfffffefb;
    goto switchD_00116864_caseD_48;
  case 'n':
    pfVar5 = (format_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&precision,"tinyformat: %n conversion spec not supported",&local_61);
    format_error::format_error(pfVar5,(string *)&precision);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pfVar5,&format_error::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_00116cf8;
  case 'o':
    lVar4 = *(long *)out;
    uVar6 = 0x40;
    break;
  case 'p':
  case 'x':
    lVar4 = *(long *)out;
LAB_00116982:
    uVar6 = 8;
    break;
  case 's':
    lVar7 = *(long *)out;
    if (bVar8) {
      *ntrunc = *(int *)(out + *(long *)(lVar7 + -0x18) + 8);
    }
    *(uint *)(out + *(long *)(lVar7 + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(lVar7 + -0x18) + 0x18) | 1;
    goto switchD_00116864_caseD_48;
  default:
    if (cVar1 != 'A') {
      if (cVar1 != '\0') goto switchD_00116864_caseD_48;
      pfVar5 = (format_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&precision,
                 "tinyformat: Conversion spec incorrectly terminated by end of string",&local_61);
      format_error::format_error(pfVar5,(string *)&precision);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pfVar5,&format_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00116cf8;
    }
    lVar7 = *(long *)out;
    *(uint *)(out + *(long *)(lVar7 + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(lVar7 + -0x18) + 0x18) | 0x4000;
LAB_00116ab8:
    *(uint *)(out + *(long *)(lVar7 + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(lVar7 + -0x18) + 0x18) | 0x104;
    goto switchD_00116864_caseD_48;
  }
  *(uint *)(out + *(long *)(lVar4 + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(lVar4 + -0x18) + 0x18) & 0xffffffb5 | uVar6;
  if (bVar2 == false && bVar8) {
    *(long *)(out + *(long *)(lVar4 + -0x18) + 0x10) =
         lVar7 + *(long *)(out + *(long *)(lVar4 + -0x18) + 8);
    *(uint *)(out + *(long *)(lVar4 + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(lVar4 + -0x18) + 0x18) & 0xffffff4f | 0x10;
    lVar7 = *(long *)(lVar4 + -0x18);
    std::ios::fill();
    out[lVar7 + 0xe0] = (ostream)0x30;
  }
  goto switchD_00116864_caseD_48;
switchD_00116864_caseD_4c:
  c = c + 1;
  goto LAB_0011684e;
switchD_00116864_caseD_48:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return c + 1;
  }
LAB_00116cf8:
  __stack_chk_fail();
}

Assistant:

inline const char* streamStateFromFormat(std::ostream& out, bool& positionalMode,
                                         bool& spacePadPositive,
                                         int& ntrunc, const char* fmtStart,
                                         const detail::FormatArg* args,
                                         int& argIndex, int numArgs)
{
    TINYFORMAT_ASSERT(*fmtStart == '%');
    // Reset stream state to defaults.
    out.width(0);
    out.precision(6);
    out.fill(' ');
    // Reset most flags; ignore irrelevant unitbuf & skipws.
    out.unsetf(std::ios::adjustfield | std::ios::basefield |
               std::ios::floatfield | std::ios::showbase | std::ios::boolalpha |
               std::ios::showpoint | std::ios::showpos | std::ios::uppercase);
    bool precisionSet = false;
    bool widthSet = false;
    int widthExtra = 0;
    const char* c = fmtStart + 1;

    // 1) Parse an argument index (if followed by '$') or a width possibly
    // preceded with '0' flag.
    if (*c >= '0' && *c <= '9') {
        const char tmpc = *c;
        int value = parseIntAndAdvance(c);
        if (*c == '$') {
            // value is an argument index
            if (value > 0 && value <= numArgs)
                argIndex = value - 1;
            else
                TINYFORMAT_ERROR("tinyformat: Positional argument out of range");
            ++c;
            positionalMode = true;
        }
        else if (positionalMode) {
            TINYFORMAT_ERROR("tinyformat: Non-positional argument used after a positional one");
        }
        else {
            if (tmpc == '0') {
                // Use internal padding so that numeric values are
                // formatted correctly, eg -00010 rather than 000-10
                out.fill('0');
                out.setf(std::ios::internal, std::ios::adjustfield);
            }
            if (value != 0) {
                // Nonzero value means that we parsed width.
                widthSet = true;
                out.width(value);
            }
        }
    }
    else if (positionalMode) {
        TINYFORMAT_ERROR("tinyformat: Non-positional argument used after a positional one");
    }
    // 2) Parse flags and width if we did not do it in previous step.
    if (!widthSet) {
        // Parse flags
        for (;; ++c) {
            switch (*c) {
                case '#':
                    out.setf(std::ios::showpoint | std::ios::showbase);
                    continue;
                case '0':
                    // overridden by left alignment ('-' flag)
                    if (!(out.flags() & std::ios::left)) {
                        // Use internal padding so that numeric values are
                        // formatted correctly, eg -00010 rather than 000-10
                        out.fill('0');
                        out.setf(std::ios::internal, std::ios::adjustfield);
                    }
                    continue;
                case '-':
                    out.fill(' ');
                    out.setf(std::ios::left, std::ios::adjustfield);
                    continue;
                case ' ':
                    // overridden by show positive sign, '+' flag.
                    if (!(out.flags() & std::ios::showpos))
                        spacePadPositive = true;
                    continue;
                case '+':
                    out.setf(std::ios::showpos);
                    spacePadPositive = false;
                    widthExtra = 1;
                    continue;
                default:
                    break;
            }
            break;
        }
        // Parse width
        int width = 0;
        widthSet = parseWidthOrPrecision(width, c, positionalMode,
                                         args, argIndex, numArgs);
        if (widthSet) {
            if (width < 0) {
                // negative widths correspond to '-' flag set
                out.fill(' ');
                out.setf(std::ios::left, std::ios::adjustfield);
                width = -width;
            }
            out.width(width);
        }
    }
    // 3) Parse precision
    if (*c == '.') {
        ++c;
        int precision = 0;
        parseWidthOrPrecision(precision, c, positionalMode,
                              args, argIndex, numArgs);
        // Presence of `.` indicates precision set, unless the inferred value
        // was negative in which case the default is used.
        precisionSet = precision >= 0;
        if (precisionSet)
            out.precision(precision);
    }
    // 4) Ignore any C99 length modifier
    while (*c == 'l' || *c == 'h' || *c == 'L' ||
           *c == 'j' || *c == 'z' || *c == 't') {
        ++c;
    }
    // 5) We're up to the conversion specifier character.
    // Set stream flags based on conversion specifier (thanks to the
    // boost::format class for forging the way here).
    bool intConversion = false;
    switch (*c) {
        case 'u': case 'd': case 'i':
            out.setf(std::ios::dec, std::ios::basefield);
            intConversion = true;
            break;
        case 'o':
            out.setf(std::ios::oct, std::ios::basefield);
            intConversion = true;
            break;
        case 'X':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'x': case 'p':
            out.setf(std::ios::hex, std::ios::basefield);
            intConversion = true;
            break;
        case 'E':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'e':
            out.setf(std::ios::scientific, std::ios::floatfield);
            out.setf(std::ios::dec, std::ios::basefield);
            break;
        case 'F':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'f':
            out.setf(std::ios::fixed, std::ios::floatfield);
            break;
        case 'A':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'a':
#           ifdef _MSC_VER
            // Workaround https://developercommunity.visualstudio.com/content/problem/520472/hexfloat-stream-output-does-not-ignore-precision-a.html
            // by always setting maximum precision on MSVC to avoid precision
            // loss for doubles.
            out.precision(13);
#           endif
            out.setf(std::ios::fixed | std::ios::scientific, std::ios::floatfield);
            break;
        case 'G':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'g':
            out.setf(std::ios::dec, std::ios::basefield);
            // As in boost::format, let stream decide float format.
            out.flags(out.flags() & ~std::ios::floatfield);
            break;
        case 'c':
            // Handled as special case inside formatValue()
            break;
        case 's':
            if (precisionSet)
                ntrunc = static_cast<int>(out.precision());
            // Make %s print Booleans as "true" and "false"
            out.setf(std::ios::boolalpha);
            break;
        case 'n':
            // Not supported - will cause problems!
            TINYFORMAT_ERROR("tinyformat: %n conversion spec not supported");
            break;
        case '\0':
            TINYFORMAT_ERROR("tinyformat: Conversion spec incorrectly "
                             "terminated by end of string");
            return c;
        default:
            break;
    }
    if (intConversion && precisionSet && !widthSet) {
        // "precision" for integers gives the minimum number of digits (to be
        // padded with zeros on the left).  This isn't really supported by the
        // iostreams, but we can approximately simulate it with the width if
        // the width isn't otherwise used.
        out.width(out.precision() + widthExtra);
        out.setf(std::ios::internal, std::ios::adjustfield);
        out.fill('0');
    }
    return c+1;
}